

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_of_source_main.cpp
# Opt level: O0

string * getApprovedFilesLocation_abi_cxx11_(void)

{
  bool bVar1;
  ulong uVar2;
  string *in_RDI;
  string locationFromEnvVar;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  string local_28 [40];
  
  ApprovalTests::SystemUtils::safeGetEnv_abi_cxx11_
            ((char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   in_stack_ffffffffffffffc0);
  }
  else {
    bVar1 = isRunningInBuildEnvironment();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)in_RDI,"{TestSourceDirectory}/",(allocator *)&stack0xffffffffffffffc7);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)in_RDI,"./{RelativeTestSourceDirectory}/",
                 (allocator *)&stack0xffffffffffffffc6);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc6);
    }
  }
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string getApprovedFilesLocation()
{
    std::string locationFromEnvVar = SystemUtils::safeGetEnv("APPROVED_FILES_ROOT_DIR");
    if (!locationFromEnvVar.empty())
    {
        return locationFromEnvVar + "/{RelativeTestSourceDirectory}/";
    }

    if (isRunningInBuildEnvironment())
    {
        return "{TestSourceDirectory}/";
    }

    return "./{RelativeTestSourceDirectory}/"; // Use current working directory
}